

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void utime_cb(uv_fs_t *req)

{
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  uv_loop_t *extraout_RAX;
  __off64_t _Var8;
  uv_buf_t *bufs;
  char *pcVar9;
  uv_fs_t *puVar10;
  uv_fs_t *unaff_R14;
  uv_fs_t *puVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uv_buf_t uVar17;
  char acStack_11fa [2];
  uv_loop_t *puStack_11f8;
  uv_buf_t uStack_1160;
  uv_buf_t uStack_1150;
  uv_loop_t *puStack_1138;
  uv_fs_t *puStack_1130;
  uv_fs_t *puStack_1128;
  uv_buf_t uStack_10f0;
  uv_buf_t uStack_10e0;
  uv_buf_t uStack_10d0;
  uv_buf_t uStack_10c0;
  char acStack_10b0 [256];
  char acStack_fb0 [256];
  char acStack_eb0 [128];
  char acStack_e30 [136];
  uv_loop_t *puStack_da8;
  uv_fs_t *puStack_da0;
  uv_loop_t *puStack_d98;
  uv_fs_t uStack_d50;
  uv_loop_t *puStack_b98;
  uv_fs_t *puStack_b90;
  code *pcStack_b88;
  uv_loop_t *puStack_b80;
  undefined1 auStack_b70 [8];
  undefined8 uStack_b68;
  uv_dirent_t uStack_b60;
  undefined1 auStack_b50 [496];
  undefined1 auStack_960 [552];
  int aiStack_738 [2];
  uv_loop_t *puStack_5d8;
  uv_loop_t *puStack_5d0;
  char *pcStack_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined1 auStack_5a8 [576];
  uv_fs_t *puStack_368;
  uv_loop_t *puStack_208;
  uv_fs_t *puStack_200;
  char acStack_1e0 [16];
  uv_fs_t uStack_1d0;
  
  if (req == &utime_req) {
    if (utime_req.result != 0) goto LAB_0015d234;
    if (utime_req.fs_type == UV_FS_UTIME) {
      check_utime(*utime_req.data,*(double *)((long)utime_req.data + 8),
                  *(double *)((long)utime_req.data + 0x10),0);
      uv_fs_req_cleanup(&utime_req);
      utime_cb_count = utime_cb_count + 1;
      return;
    }
  }
  else {
    utime_cb_cold_1();
LAB_0015d234:
    utime_cb_cold_2();
  }
  utime_cb_cold_3();
  builtin_strncpy(acStack_1e0,"test_file",10);
  loop = uv_default_loop();
  unlink(acStack_1e0);
  uVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_1d0,acStack_1e0,0x42,0x180,(uv_fs_cb)0x0);
  puVar6 = (uv_loop_t *)(ulong)uVar3;
  if ((int)uVar3 < 0) {
    run_test_fs_utime_round_cold_6();
LAB_0015d3ec:
    run_test_fs_utime_round_cold_5();
LAB_0015d3f9:
    run_test_fs_utime_round_cold_1();
LAB_0015d406:
    run_test_fs_utime_round_cold_2();
LAB_0015d413:
    run_test_fs_utime_round_cold_3();
  }
  else {
    if (uStack_1d0.result < 0) goto LAB_0015d3ec;
    unaff_R14 = &uStack_1d0;
    uv_fs_req_cleanup(unaff_R14);
    iVar4 = uv_fs_close(loop,unaff_R14,uVar3,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015d3f9;
    iVar4 = uv_fs_utime((uv_loop_t *)0x0,&uStack_1d0,acStack_1e0,-14245440.25,-14245440.25,
                        (uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015d406;
    if (uStack_1d0.result != 0) goto LAB_0015d413;
    uv_fs_req_cleanup(&uStack_1d0);
    check_utime(acStack_1e0,-14245440.25,-14245440.25,0);
    unlink(acStack_1e0);
    puVar6 = uv_default_loop();
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    uv_run(puVar6,UV_RUN_DEFAULT);
    puVar7 = uv_default_loop();
    iVar4 = uv_loop_close(puVar7);
    if (iVar4 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  run_test_fs_utime_round_cold_4();
  auStack_5a8._456_8_ = (uv__io_cb)0x15d436;
  puStack_208 = puVar6;
  puStack_200 = unaff_R14;
  loop = uv_default_loop();
  auStack_5a8._456_8_ = (uv__io_cb)0x15d44c;
  unlink("test_file");
  puVar6 = (uv_loop_t *)0x0;
  auStack_5a8._456_8_ = (uv__io_cb)0x15d469;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_5a8 + 0x1e8),"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  if (iVar4 < 0) {
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5ed;
    run_test_fs_futime_cold_1();
LAB_0015d5ed:
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5f2;
    run_test_fs_futime_cold_2();
LAB_0015d5f2:
    puVar11 = unaff_R14;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5f7;
    run_test_fs_futime_cold_3();
LAB_0015d5f7:
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5fc;
    run_test_fs_futime_cold_4();
LAB_0015d5fc:
    auStack_5a8._456_8_ = (uv__io_cb)0x15d601;
    run_test_fs_futime_cold_5();
LAB_0015d601:
    auStack_5a8._456_8_ = (uv__io_cb)0x15d606;
    run_test_fs_futime_cold_6();
LAB_0015d606:
    auStack_5a8._456_8_ = (uv__io_cb)0x15d60b;
    run_test_fs_futime_cold_7();
LAB_0015d60b:
    puVar7 = (uv_loop_t *)0x1a3527;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d610;
    run_test_fs_futime_cold_8();
  }
  else {
    if ((long)puStack_368 < 0) goto LAB_0015d5ed;
    unaff_R14 = (uv_fs_t *)(auStack_5a8 + 0x1e8);
    auStack_5a8._456_8_ = (uv__io_cb)0x15d48c;
    uv_fs_req_cleanup(unaff_R14);
    auStack_5a8._456_8_ = (uv__io_cb)0x15d49f;
    uv_fs_close(loop,unaff_R14,iVar4,(uv_fs_cb)0x0);
    puVar6 = (uv_loop_t *)0x0;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d4be;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,unaff_R14,"test_file",2,0,(uv_fs_cb)0x0);
    puVar11 = puStack_368;
    if (iVar4 < 0) goto LAB_0015d5f2;
    if ((long)puStack_368 < 0) goto LAB_0015d5f7;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d4e1;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_5a8 + 0x1e8));
    puVar6 = (uv_loop_t *)0x0;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d4fb;
    iVar4 = uv_fs_futime((uv_loop_t *)0x0,(uv_fs_t *)(auStack_5a8 + 0x1e8),(uv_file)puVar11,
                         400497753.25,400497753.25,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015d5fc;
    if (puStack_368 != (uv_fs_t *)0x0) goto LAB_0015d601;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d519;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_5a8 + 0x1e8));
    auStack_5a8._456_8_ = (uv__io_cb)0x15d52e;
    check_utime("test_file",400497753.25,400497753.25,0);
    auStack_5a8._472_8_ = (void *)0x41d33e5199000000;
    auStack_5a8._480_8_ = (void *)0x41d33e5199000000;
    auStack_5a8._464_8_ = "test_file";
    auStack_5a8._456_8_ = (uv__io_cb)0x15d575;
    puVar6 = loop;
    futime_req.data = auStack_5a8 + 0x1d0;
    iVar4 = uv_fs_futime(loop,&futime_req,(uv_file)puVar11,1291404900.0,1291404900.0,futime_cb);
    if (iVar4 != 0) goto LAB_0015d606;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d58b;
    puVar6 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (futime_cb_count != 1) goto LAB_0015d60b;
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5a0;
    unlink("test_file");
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5a5;
    puVar7 = uv_default_loop();
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5b9;
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5c3;
    uv_run(puVar7,UV_RUN_DEFAULT);
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5c8;
    puVar6 = uv_default_loop();
    auStack_5a8._456_8_ = (uv__io_cb)0x15d5d0;
    iVar4 = uv_loop_close(puVar6);
    if (iVar4 == 0) {
      auStack_5a8._456_8_ = (uv__io_cb)0x15d5d9;
      uv_library_shutdown();
      return;
    }
  }
  auStack_5a8._456_8_ = futime_cb;
  run_test_fs_futime_cold_9();
  auStack_5a8._456_8_ = puVar7;
  if (puVar6 == (uv_loop_t *)&futime_req) {
    if (futime_req.result != 0) goto LAB_0015d66c;
    if (futime_req.fs_type == UV_FS_FUTIME) {
      auStack_5a8._448_8_ = (_func_void *)0x15d657;
      check_utime(*futime_req.data,*(double *)((long)futime_req.data + 8),
                  *(double *)((long)futime_req.data + 0x10),0);
      auStack_5a8._448_8_ = (_func_void *)0x15d65f;
      uv_fs_req_cleanup(&futime_req);
      futime_cb_count = futime_cb_count + 1;
      return;
    }
  }
  else {
    auStack_5a8._448_8_ = (_func_void *)0x15d66c;
    futime_cb_cold_1();
LAB_0015d66c:
    auStack_5a8._448_8_ = (_func_void *)0x15d671;
    futime_cb_cold_2();
  }
  auStack_5a8._448_8_ = run_test_fs_lutime;
  futime_cb_cold_3();
  puStack_5d0 = (uv_loop_t *)0x15d685;
  auStack_5a8._440_8_ = puVar7;
  auStack_5a8._448_8_ = puVar11;
  loop = uv_default_loop();
  pcVar9 = "test_file";
  puStack_5d0 = (uv_loop_t *)0x15d69b;
  unlink("test_file");
  puVar6 = (uv_loop_t *)0x0;
  puStack_5d0 = (uv_loop_t *)0x15d6b8;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_5a8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    puStack_5d0 = (uv_loop_t *)0x15d853;
    run_test_fs_lutime_cold_1();
LAB_0015d853:
    puStack_5d0 = (uv_loop_t *)0x15d858;
    run_test_fs_lutime_cold_2();
LAB_0015d858:
    puStack_5d0 = (uv_loop_t *)0x15d85d;
    run_test_fs_lutime_cold_3();
LAB_0015d85d:
    puStack_5d0 = (uv_loop_t *)0x15d862;
    run_test_fs_lutime_cold_4();
LAB_0015d862:
    puStack_5d0 = (uv_loop_t *)0x15d867;
    run_test_fs_lutime_cold_5();
LAB_0015d867:
    puStack_5d0 = (uv_loop_t *)0x15d86c;
    run_test_fs_lutime_cold_6();
LAB_0015d86c:
    puStack_5d0 = (uv_loop_t *)0x15d871;
    run_test_fs_lutime_cold_7();
LAB_0015d871:
    puStack_5d0 = (uv_loop_t *)0x15d876;
    run_test_fs_lutime_cold_8();
  }
  else {
    if ((long)auStack_5a8._88_8_ < 0) goto LAB_0015d853;
    puVar11 = (uv_fs_t *)auStack_5a8;
    puStack_5d0 = (uv_loop_t *)0x15d6db;
    uv_fs_req_cleanup(puVar11);
    puStack_5d0 = (uv_loop_t *)0x15d6ee;
    uv_fs_close(loop,puVar11,iVar4,(uv_fs_cb)0x0);
    pcVar9 = "test_file_symlink";
    puStack_5d0 = (uv_loop_t *)0x15d6fd;
    unlink("test_file_symlink");
    puVar6 = (uv_loop_t *)0x0;
    puStack_5d0 = (uv_loop_t *)0x15d717;
    iVar4 = uv_fs_symlink((uv_loop_t *)0x0,puVar11,"test_file","test_file_symlink",0,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015d858;
    if ((void *)auStack_5a8._88_8_ != (void *)0x0) goto LAB_0015d85d;
    puVar11 = (uv_fs_t *)auStack_5a8;
    puStack_5d0 = (uv_loop_t *)0x15d738;
    uv_fs_req_cleanup(puVar11);
    auStack_5a8._0_8_ = &pcStack_5c0;
    uStack_5b8 = 0x41b7df1c59400000;
    uStack_5b0 = 0x41b7df1c59400000;
    pcStack_5c0 = "test_file_symlink";
    puVar6 = (uv_loop_t *)0x0;
    puStack_5d0 = (uv_loop_t *)0x15d76f;
    iVar4 = uv_fs_lutime((uv_loop_t *)0x0,puVar11,"test_file_symlink",400497753.25,400497753.25,
                         (uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015d862;
    puVar6 = (uv_loop_t *)auStack_5a8;
    puStack_5d0 = (uv_loop_t *)0x15d781;
    lutime_cb((uv_fs_t *)puVar6);
    if (lutime_cb_count != 1) goto LAB_0015d867;
    uStack_5b8 = 0x41d33e5199000000;
    uStack_5b0 = 0x41d33e5199000000;
    pcStack_5c0 = "test_file_symlink";
    puStack_5d0 = (uv_loop_t *)0x15d7cd;
    puVar6 = loop;
    iVar4 = uv_fs_lutime(loop,(uv_fs_t *)auStack_5a8,"test_file_symlink",1291404900.0,1291404900.0,
                         lutime_cb);
    if (iVar4 != 0) goto LAB_0015d86c;
    puStack_5d0 = (uv_loop_t *)0x15d7e3;
    puVar6 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (lutime_cb_count != 2) goto LAB_0015d871;
    puStack_5d0 = (uv_loop_t *)0x15d7fc;
    unlink("test_file");
    puStack_5d0 = (uv_loop_t *)0x15d808;
    unlink("test_file_symlink");
    puStack_5d0 = (uv_loop_t *)0x15d80d;
    pcVar9 = (char *)uv_default_loop();
    puStack_5d0 = (uv_loop_t *)0x15d821;
    uv_walk((uv_loop_t *)pcVar9,close_walk_cb,(void *)0x0);
    puStack_5d0 = (uv_loop_t *)0x15d82b;
    uv_run((uv_loop_t *)pcVar9,UV_RUN_DEFAULT);
    puStack_5d0 = (uv_loop_t *)0x15d830;
    puVar6 = uv_default_loop();
    puStack_5d0 = (uv_loop_t *)0x15d838;
    iVar4 = uv_loop_close(puVar6);
    if (iVar4 == 0) {
      puStack_5d0 = (uv_loop_t *)0x15d841;
      uv_library_shutdown();
      return;
    }
  }
  puStack_5d0 = (uv_loop_t *)lutime_cb;
  run_test_fs_lutime_cold_9();
  puStack_5d0 = (uv_loop_t *)pcVar9;
  if (puVar6->watcher_queue[0] == (void *)0x0) {
    if (puVar6->backend_fd == 0x24) {
      puVar1 = (undefined8 *)puVar6->data;
      puStack_5d8 = (uv_loop_t *)0x15d8a6;
      check_utime((char *)*puVar1,(double)puVar1[1],(double)puVar1[2],1);
      puStack_5d8 = (uv_loop_t *)0x15d8ae;
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      lutime_cb_count = lutime_cb_count + 1;
      return;
    }
  }
  else {
    puStack_5d8 = (uv_loop_t *)0x15d8bb;
    lutime_cb_cold_1();
    puVar6 = (uv_loop_t *)pcVar9;
  }
  puStack_5d8 = (uv_loop_t *)run_test_fs_stat_missing_path;
  lutime_cb_cold_2();
  auStack_960._448_8_ = (_func_void *)0x15d8cd;
  puStack_5d8 = puVar6;
  loop = uv_default_loop();
  auStack_960._448_8_ = (_func_void *)0x15d8e9;
  iVar4 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)(auStack_960 + 0x1d0),"non_existent_file",
                     (uv_fs_cb)0x0);
  if (iVar4 == -2) {
    if (aiStack_738 != (int  [2])0xfffffffffffffffe) goto LAB_0015d949;
    auStack_960._448_8_ = (_func_void *)0x15d900;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_960 + 0x1d0));
    auStack_960._448_8_ = (_func_void *)0x15d905;
    puVar6 = uv_default_loop();
    auStack_960._448_8_ = (_func_void *)0x15d919;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    auStack_960._448_8_ = (_func_void *)0x15d923;
    uv_run(puVar6,UV_RUN_DEFAULT);
    auStack_960._448_8_ = (_func_void *)0x15d928;
    puVar7 = uv_default_loop();
    auStack_960._448_8_ = (_func_void *)0x15d930;
    iVar4 = uv_loop_close(puVar7);
    if (iVar4 == 0) {
      auStack_960._448_8_ = (_func_void *)0x15d939;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_960._448_8_ = (_func_void *)0x15d949;
    run_test_fs_stat_missing_path_cold_1();
LAB_0015d949:
    auStack_960._448_8_ = (_func_void *)0x15d94e;
    run_test_fs_stat_missing_path_cold_2();
  }
  auStack_960._448_8_ = run_test_fs_scandir_empty_dir;
  run_test_fs_stat_missing_path_cold_3();
  auStack_b50._472_8_ = (void *)0x15d962;
  auStack_960._440_8_ = puVar6;
  auStack_960._448_8_ = puVar11;
  loop = uv_default_loop();
  pcVar9 = "./empty_dir/";
  auStack_b50._472_8_ = (void *)0x15d98a;
  uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)auStack_960,"./empty_dir/",0x1ff,(uv_fs_cb)0x0);
  auStack_b50._472_8_ = (void *)0x15d992;
  uv_fs_req_cleanup((uv_fs_t *)auStack_960);
  auStack_b50._472_8_ = (void *)0x15d9a4;
  memset((uv_fs_t *)auStack_960,0xdb,0x1b8);
  puVar6 = (uv_loop_t *)0x0;
  auStack_b50._472_8_ = (void *)0x15d9b6;
  iVar4 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)auStack_960,"./empty_dir/",0,(uv_fs_cb)0x0);
  if (iVar4 == 0) {
    if ((void *)auStack_960._88_8_ != (void *)0x0) goto LAB_0015dab8;
    puVar6 = (uv_loop_t *)auStack_960._96_8_;
    if ((uv_loop_t *)auStack_960._96_8_ != (uv_loop_t *)0x0) goto LAB_0015dabd;
    puVar6 = (uv_loop_t *)auStack_960;
    auStack_b50._472_8_ = (void *)0x15d9e5;
    iVar4 = uv_fs_scandir_next((uv_fs_t *)puVar6,(uv_dirent_t *)(auStack_b50 + 0x1e0));
    if (iVar4 != -0xfff) goto LAB_0015dac2;
    auStack_b50._472_8_ = (void *)0x15d9fa;
    uv_fs_req_cleanup((uv_fs_t *)auStack_960);
    auStack_b50._472_8_ = (void *)0x15da1d;
    puVar6 = loop;
    iVar4 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
    if (iVar4 != 0) goto LAB_0015dac7;
    if (scandir_cb_count != 0) goto LAB_0015dacc;
    auStack_b50._472_8_ = (void *)0x15da40;
    puVar6 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_0015dad1;
    auStack_b50._472_8_ = (void *)0x15da65;
    uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)auStack_960,"./empty_dir/",(uv_fs_cb)0x0);
    auStack_b50._472_8_ = (void *)0x15da6d;
    uv_fs_req_cleanup((uv_fs_t *)auStack_960);
    auStack_b50._472_8_ = (void *)0x15da72;
    pcVar9 = (char *)uv_default_loop();
    auStack_b50._472_8_ = (void *)0x15da86;
    uv_walk((uv_loop_t *)pcVar9,close_walk_cb,(void *)0x0);
    auStack_b50._472_8_ = (void *)0x15da90;
    uv_run((uv_loop_t *)pcVar9,UV_RUN_DEFAULT);
    auStack_b50._472_8_ = (void *)0x15da95;
    puVar6 = uv_default_loop();
    auStack_b50._472_8_ = (void *)0x15da9d;
    iVar4 = uv_loop_close(puVar6);
    if (iVar4 == 0) {
      auStack_b50._472_8_ = (void *)0x15daa6;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_b50._472_8_ = (void *)0x15dab8;
    run_test_fs_scandir_empty_dir_cold_1();
LAB_0015dab8:
    auStack_b50._472_8_ = (void *)0x15dabd;
    run_test_fs_scandir_empty_dir_cold_2();
LAB_0015dabd:
    auStack_b50._472_8_ = (void *)0x15dac2;
    run_test_fs_scandir_empty_dir_cold_3();
LAB_0015dac2:
    auStack_b50._472_8_ = (void *)0x15dac7;
    run_test_fs_scandir_empty_dir_cold_4();
LAB_0015dac7:
    auStack_b50._472_8_ = (void *)0x15dacc;
    run_test_fs_scandir_empty_dir_cold_5();
LAB_0015dacc:
    auStack_b50._472_8_ = (void *)0x15dad1;
    run_test_fs_scandir_empty_dir_cold_6();
LAB_0015dad1:
    auStack_b50._472_8_ = (void *)0x15dad6;
    run_test_fs_scandir_empty_dir_cold_7();
  }
  auStack_b50._472_8_ = empty_scandir_cb;
  run_test_fs_scandir_empty_dir_cold_8();
  if (puVar6 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015db3e;
    if (scandir_req.result != 0) goto LAB_0015db43;
    if (scandir_req.ptr != (void *)0x0) goto LAB_0015db48;
    auStack_b50._448_8_ = (_func_void *)0x15db1b;
    iVar4 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)(auStack_b50 + 0x1d0));
    if (iVar4 == -0xfff) {
      auStack_b50._448_8_ = (_func_void *)0x15db2e;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return;
    }
  }
  else {
    auStack_b50._448_8_ = (_func_void *)0x15db3e;
    empty_scandir_cb_cold_1();
LAB_0015db3e:
    auStack_b50._448_8_ = (_func_void *)0x15db43;
    empty_scandir_cb_cold_2();
LAB_0015db43:
    auStack_b50._448_8_ = (_func_void *)0x15db48;
    empty_scandir_cb_cold_3();
LAB_0015db48:
    auStack_b50._448_8_ = (_func_void *)0x15db4d;
    empty_scandir_cb_cold_4();
  }
  auStack_b50._448_8_ = run_test_fs_scandir_non_existent_dir;
  empty_scandir_cb_cold_5();
  uStack_b68._0_4_ = 0x15db61;
  uStack_b68._4_4_ = 0;
  auStack_b50._440_8_ = pcVar9;
  auStack_b50._448_8_ = (uv_fs_t *)auStack_960;
  loop = uv_default_loop();
  pcVar9 = "./non_existent_dir/";
  puVar11 = (uv_fs_t *)auStack_b50;
  uStack_b68._0_4_ = 0x15db83;
  uStack_b68._4_4_ = 0;
  uv_fs_rmdir((uv_loop_t *)0x0,puVar11,"./non_existent_dir/",(uv_fs_cb)0x0);
  uStack_b68._0_4_ = 0x15db8b;
  uStack_b68._4_4_ = 0;
  uv_fs_req_cleanup(puVar11);
  uStack_b68._0_4_ = 0x15db9d;
  uStack_b68._4_4_ = 0;
  memset(puVar11,0xdb,0x1b8);
  puVar6 = (uv_loop_t *)0x0;
  uStack_b68._0_4_ = 0x15dbaf;
  uStack_b68._4_4_ = 0;
  iVar4 = uv_fs_scandir((uv_loop_t *)0x0,puVar11,"./non_existent_dir/",0,(uv_fs_cb)0x0);
  if (iVar4 == -2) {
    if ((void *)auStack_b50._88_8_ != (void *)0xfffffffffffffffe) goto LAB_0015dc84;
    puVar6 = (uv_loop_t *)auStack_b50._96_8_;
    if ((uv_loop_t *)auStack_b50._96_8_ != (uv_loop_t *)0x0) goto LAB_0015dc89;
    puVar6 = (uv_loop_t *)auStack_b50;
    uStack_b68._0_4_ = 0x15dbdf;
    uStack_b68._4_4_ = 0;
    iVar4 = uv_fs_scandir_next((uv_fs_t *)puVar6,&uStack_b60);
    if (iVar4 != -2) goto LAB_0015dc8e;
    uStack_b68._0_4_ = 0x15dbf2;
    uStack_b68._4_4_ = 0;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b50);
    uStack_b68._0_4_ = 0x15dc15;
    uStack_b68._4_4_ = 0;
    puVar6 = loop;
    iVar4 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
    if (iVar4 != 0) goto LAB_0015dc93;
    if (scandir_cb_count != 0) goto LAB_0015dc98;
    uStack_b68._0_4_ = 0x15dc30;
    uStack_b68._4_4_ = 0;
    puVar6 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_0015dc9d;
    uStack_b68._0_4_ = 0x15dc3e;
    uStack_b68._4_4_ = 0;
    pcVar9 = (char *)uv_default_loop();
    uStack_b68._0_4_ = 0x15dc52;
    uStack_b68._4_4_ = 0;
    uv_walk((uv_loop_t *)pcVar9,close_walk_cb,(void *)0x0);
    uStack_b68._0_4_ = 0x15dc5c;
    uStack_b68._4_4_ = 0;
    uv_run((uv_loop_t *)pcVar9,UV_RUN_DEFAULT);
    uStack_b68._0_4_ = 0x15dc61;
    uStack_b68._4_4_ = 0;
    puVar6 = uv_default_loop();
    uStack_b68._0_4_ = 0x15dc69;
    uStack_b68._4_4_ = 0;
    iVar4 = uv_loop_close(puVar6);
    if (iVar4 == 0) {
      uStack_b68._0_4_ = 0x15dc72;
      uStack_b68._4_4_ = 0;
      uv_library_shutdown();
      return;
    }
  }
  else {
    uStack_b68._0_4_ = 0x15dc84;
    uStack_b68._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_1();
LAB_0015dc84:
    uStack_b68._0_4_ = 0x15dc89;
    uStack_b68._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_2();
LAB_0015dc89:
    uStack_b68._0_4_ = 0x15dc8e;
    uStack_b68._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_3();
LAB_0015dc8e:
    uStack_b68._0_4_ = 0x15dc93;
    uStack_b68._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_4();
LAB_0015dc93:
    uStack_b68._0_4_ = 0x15dc98;
    uStack_b68._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_5();
LAB_0015dc98:
    uStack_b68._0_4_ = 0x15dc9d;
    uStack_b68._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_6();
LAB_0015dc9d:
    uStack_b68._0_4_ = 0x15dca2;
    uStack_b68._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_7();
  }
  uStack_b68 = non_existent_scandir_cb;
  run_test_fs_scandir_non_existent_dir_cold_8();
  if (puVar6 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015dd08;
    if (scandir_req.result != -2) goto LAB_0015dd0d;
    if (scandir_req.ptr != (void *)0x0) goto LAB_0015dd12;
    puStack_b80 = (uv_loop_t *)0x15dce7;
    iVar4 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)auStack_b70);
    if (iVar4 == -2) {
      puStack_b80 = (uv_loop_t *)0x15dcf8;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return;
    }
  }
  else {
    puStack_b80 = (uv_loop_t *)0x15dd08;
    non_existent_scandir_cb_cold_1();
LAB_0015dd08:
    puStack_b80 = (uv_loop_t *)0x15dd0d;
    non_existent_scandir_cb_cold_2();
LAB_0015dd0d:
    puStack_b80 = (uv_loop_t *)0x15dd12;
    non_existent_scandir_cb_cold_3();
LAB_0015dd12:
    puStack_b80 = (uv_loop_t *)0x15dd17;
    non_existent_scandir_cb_cold_4();
  }
  puStack_b80 = (uv_loop_t *)run_test_fs_scandir_file;
  non_existent_scandir_cb_cold_5();
  pcStack_b88 = (code *)0x15dd22;
  puStack_b80 = (uv_loop_t *)pcVar9;
  loop = uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  pcStack_b88 = (code *)0x15dd43;
  iVar4 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test/fixtures/empty_file",0,(uv_fs_cb)0x0);
  if (iVar4 == -0x14) {
    puVar10 = &scandir_req;
    pcStack_b88 = (code *)0x15dd5b;
    uv_fs_req_cleanup(&scandir_req);
    pcStack_b88 = (code *)0x15dd7a;
    puVar6 = loop;
    iVar4 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    if (iVar4 != 0) goto LAB_0015dde0;
    if (scandir_cb_count != 0) goto LAB_0015dde5;
    pcStack_b88 = (code *)0x15dd95;
    puVar6 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_0015ddea;
    pcStack_b88 = (code *)0x15dda3;
    puVar10 = (uv_fs_t *)uv_default_loop();
    pcStack_b88 = (code *)0x15ddb7;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    pcStack_b88 = (code *)0x15ddc1;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    pcStack_b88 = (code *)0x15ddc6;
    puVar6 = uv_default_loop();
    pcStack_b88 = (code *)0x15ddce;
    iVar4 = uv_loop_close(puVar6);
    if (iVar4 == 0) {
      pcStack_b88 = (code *)0x15ddd7;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_b88 = (code *)0x15dde0;
    run_test_fs_scandir_file_cold_1();
    puVar10 = (uv_fs_t *)pcVar9;
LAB_0015dde0:
    pcStack_b88 = (code *)0x15dde5;
    run_test_fs_scandir_file_cold_2();
LAB_0015dde5:
    pcStack_b88 = (code *)0x15ddea;
    run_test_fs_scandir_file_cold_3();
LAB_0015ddea:
    pcStack_b88 = (code *)0x15ddef;
    run_test_fs_scandir_file_cold_4();
  }
  pcStack_b88 = file_scandir_cb;
  run_test_fs_scandir_file_cold_5();
  if (puVar6 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015de39;
    if (scandir_req.result != -0x14) goto LAB_0015de3e;
    if (scandir_req.ptr == (void *)0x0) {
      puStack_b90 = (uv_fs_t *)0x15de2c;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return;
    }
  }
  else {
    puStack_b90 = (uv_fs_t *)0x15de39;
    file_scandir_cb_cold_1();
LAB_0015de39:
    puStack_b90 = (uv_fs_t *)0x15de3e;
    file_scandir_cb_cold_2();
LAB_0015de3e:
    puStack_b90 = (uv_fs_t *)0x15de43;
    file_scandir_cb_cold_3();
  }
  puStack_b90 = (uv_fs_t *)run_test_fs_open_dir;
  file_scandir_cb_cold_4();
  puStack_b98 = (uv_loop_t *)puVar10;
  puStack_b90 = puVar11;
  loop = uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&uStack_d50,".",0,0,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    run_test_fs_open_dir_cold_1();
LAB_0015df4d:
    run_test_fs_open_dir_cold_2();
LAB_0015df52:
    run_test_fs_open_dir_cold_3();
LAB_0015df57:
    run_test_fs_open_dir_cold_4();
LAB_0015df5c:
    run_test_fs_open_dir_cold_5();
LAB_0015df61:
    run_test_fs_open_dir_cold_6();
LAB_0015df66:
    run_test_fs_open_dir_cold_7();
  }
  else {
    if (uStack_d50.result < 0) goto LAB_0015df4d;
    puVar6 = (uv_loop_t *)uStack_d50.ptr;
    if ((uv_loop_t *)uStack_d50.ptr != (uv_loop_t *)0x0) goto LAB_0015df52;
    uv_fs_req_cleanup(&uStack_d50);
    puVar6 = (uv_loop_t *)0x0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&uStack_d50,iVar4,(uv_fs_cb)0x0);
    puVar11 = &uStack_d50;
    if (iVar4 != 0) goto LAB_0015df57;
    puVar6 = loop;
    iVar4 = uv_fs_open(loop,&uStack_d50,".",0,0,open_cb_simple);
    puVar11 = &uStack_d50;
    if (iVar4 != 0) goto LAB_0015df5c;
    puVar11 = &uStack_d50;
    if (open_cb_count != 0) goto LAB_0015df61;
    puVar6 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar11 = &uStack_d50;
    if (open_cb_count != 1) goto LAB_0015df66;
    puVar6 = uv_default_loop();
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    uv_run(puVar6,UV_RUN_DEFAULT);
    puVar6 = uv_default_loop();
    iVar4 = uv_loop_close(puVar6);
    puVar11 = &uStack_d50;
    if (iVar4 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  run_test_fs_open_dir_cold_8();
  if (puVar6->backend_fd == 1) {
    puVar7 = (uv_loop_t *)puVar6->watcher_queue[0];
    if ((long)puVar7 < 0) goto LAB_0015df98;
    open_cb_count = open_cb_count + 1;
    puVar7 = puVar6;
    if (puVar6->watchers != (uv__io_t **)0x0) {
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      return;
    }
  }
  else {
    open_cb_simple_cold_1();
    puVar7 = extraout_RAX;
LAB_0015df98:
    open_cb_simple_cold_3();
  }
  iVar4 = (int)puVar7;
  open_cb_simple_cold_2();
  fs_file_open_append(iVar4);
  fs_file_open_append(iVar4);
  puVar6 = uv_default_loop();
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  uv_run(puVar6,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar4 = uv_loop_close(puVar6);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_open_append_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    fs_file_open_append_cold_1();
LAB_0015e326:
    fs_file_open_append_cold_2();
LAB_0015e32b:
    fs_file_open_append_cold_3();
LAB_0015e330:
    fs_file_open_append_cold_4();
LAB_0015e335:
    fs_file_open_append_cold_5();
LAB_0015e33a:
    fs_file_open_append_cold_6();
LAB_0015e33f:
    fs_file_open_append_cold_7();
LAB_0015e344:
    fs_file_open_append_cold_8();
LAB_0015e349:
    fs_file_open_append_cold_9();
LAB_0015e34e:
    fs_file_open_append_cold_10();
LAB_0015e353:
    fs_file_open_append_cold_11();
LAB_0015e358:
    fs_file_open_append_cold_12();
LAB_0015e35d:
    fs_file_open_append_cold_13();
LAB_0015e362:
    fs_file_open_append_cold_14();
LAB_0015e367:
    fs_file_open_append_cold_15();
LAB_0015e36c:
    fs_file_open_append_cold_16();
LAB_0015e371:
    fs_file_open_append_cold_17();
LAB_0015e376:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015e326;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015e32b;
    if (write_req.result < 0) goto LAB_0015e330;
    uv_fs_req_cleanup(&write_req);
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015e335;
    if (close_req.result != 0) goto LAB_0015e33a;
    uv_fs_req_cleanup(&close_req);
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x402,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015e33f;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e344;
    uv_fs_req_cleanup(&open_req1);
    uVar17 = uv_buf_init(test_buf,0xd);
    iov = uVar17;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015e349;
    if (write_req.result < 0) goto LAB_0015e34e;
    uv_fs_req_cleanup(&write_req);
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015e353;
    if (close_req.result != 0) goto LAB_0015e358;
    uv_fs_req_cleanup(&close_req);
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0x100,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015e35d;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e362;
    uv_fs_req_cleanup(&open_req1);
    uVar17 = uv_buf_init(buf,0x20);
    iov = uVar17;
    uVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_0015e367;
    if (read_req.result != 0x1a) goto LAB_0015e36c;
    auVar16[0] = -(buf[10] == 'r');
    auVar16[1] = -(buf[0xb] == '\n');
    auVar16[2] = -(buf[0xc] == '\0');
    auVar16[3] = -(buf[0xd] == 't');
    auVar16[4] = -(buf[0xe] == 'e');
    auVar16[5] = -(buf[0xf] == 's');
    auVar16[6] = -(buf[0x10] == 't');
    auVar16[7] = -(buf[0x11] == '-');
    auVar16[8] = -(buf[0x12] == 'b');
    auVar16[9] = -(buf[0x13] == 'u');
    auVar16[10] = -(buf[0x14] == 'f');
    auVar16[0xb] = -(buf[0x15] == 'f');
    auVar16[0xc] = -(buf[0x16] == 'e');
    auVar16[0xd] = -(buf[0x17] == 'r');
    auVar16[0xe] = -(buf[0x18] == '\n');
    auVar16[0xf] = -(buf[0x19] == '\0');
    auVar15[0] = -(buf[0] == 't');
    auVar15[1] = -(buf[1] == 'e');
    auVar15[2] = -(buf[2] == 's');
    auVar15[3] = -(buf[3] == 't');
    auVar15[4] = -(buf[4] == '-');
    auVar15[5] = -(buf[5] == 'b');
    auVar15[6] = -(buf[6] == 'u');
    auVar15[7] = -(buf[7] == 'f');
    auVar15[8] = -(buf[8] == 'f');
    auVar15[9] = -(buf[9] == 'e');
    auVar15[10] = -(buf[10] == 'r');
    auVar15[0xb] = -(buf[0xb] == '\n');
    auVar15[0xc] = -(buf[0xc] == '\0');
    auVar15[0xd] = -(buf[0xd] == 't');
    auVar15[0xe] = -(buf[0xe] == 'e');
    auVar15[0xf] = -(buf[0xf] == 's');
    auVar15 = auVar15 & auVar16;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e371;
    uv_fs_req_cleanup(&read_req);
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015e376;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_open_append_cold_19();
  puVar6 = (uv_loop_t *)0x1a3527;
  puStack_d98 = (uv_loop_t *)0x15e394;
  unlink("test_file");
  puStack_d98 = (uv_loop_t *)0x15e3a0;
  unlink("test_file2");
  puStack_d98 = (uv_loop_t *)0x15e3a5;
  loop = uv_default_loop();
  iVar5 = 0;
  puStack_d98 = (uv_loop_t *)0x15e3cb;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    puStack_d98 = (uv_loop_t *)0x15e6c6;
    run_test_fs_rename_to_existing_file_cold_1();
LAB_0015e6c6:
    puStack_d98 = (uv_loop_t *)0x15e6cb;
    run_test_fs_rename_to_existing_file_cold_2();
LAB_0015e6cb:
    puStack_d98 = (uv_loop_t *)0x15e6d0;
    run_test_fs_rename_to_existing_file_cold_3();
LAB_0015e6d0:
    puStack_d98 = (uv_loop_t *)0x15e6d5;
    run_test_fs_rename_to_existing_file_cold_4();
LAB_0015e6d5:
    puStack_d98 = (uv_loop_t *)0x15e6da;
    run_test_fs_rename_to_existing_file_cold_5();
LAB_0015e6da:
    puStack_d98 = (uv_loop_t *)0x15e6df;
    run_test_fs_rename_to_existing_file_cold_6();
LAB_0015e6df:
    puStack_d98 = (uv_loop_t *)0x15e6e4;
    run_test_fs_rename_to_existing_file_cold_7();
LAB_0015e6e4:
    puStack_d98 = (uv_loop_t *)0x15e6e9;
    run_test_fs_rename_to_existing_file_cold_8();
LAB_0015e6e9:
    puStack_d98 = (uv_loop_t *)0x15e6ee;
    run_test_fs_rename_to_existing_file_cold_9();
LAB_0015e6ee:
    puStack_d98 = (uv_loop_t *)0x15e6f3;
    run_test_fs_rename_to_existing_file_cold_10();
LAB_0015e6f3:
    puStack_d98 = (uv_loop_t *)0x15e6f8;
    run_test_fs_rename_to_existing_file_cold_11();
LAB_0015e6f8:
    puStack_d98 = (uv_loop_t *)0x15e6fd;
    run_test_fs_rename_to_existing_file_cold_12();
LAB_0015e6fd:
    puStack_d98 = (uv_loop_t *)0x15e702;
    run_test_fs_rename_to_existing_file_cold_13();
LAB_0015e702:
    puStack_d98 = (uv_loop_t *)0x15e707;
    run_test_fs_rename_to_existing_file_cold_14();
LAB_0015e707:
    puStack_d98 = (uv_loop_t *)0x15e70c;
    run_test_fs_rename_to_existing_file_cold_15();
LAB_0015e70c:
    puStack_d98 = (uv_loop_t *)0x15e711;
    run_test_fs_rename_to_existing_file_cold_16();
LAB_0015e711:
    puStack_d98 = (uv_loop_t *)0x15e716;
    run_test_fs_rename_to_existing_file_cold_17();
LAB_0015e716:
    puStack_d98 = (uv_loop_t *)0x15e71b;
    run_test_fs_rename_to_existing_file_cold_18();
LAB_0015e71b:
    puStack_d98 = (uv_loop_t *)0x15e720;
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015e6c6;
    puStack_d98 = (uv_loop_t *)0x15e3ed;
    uv_fs_req_cleanup(&open_req1);
    puStack_d98 = (uv_loop_t *)0x15e3fe;
    uVar17 = uv_buf_init(test_buf,0xd);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e43c;
    iov = uVar17;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015e6cb;
    if (write_req.result < 0) goto LAB_0015e6d0;
    puStack_d98 = (uv_loop_t *)0x15e45e;
    uv_fs_req_cleanup(&write_req);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e474;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015e6d5;
    if (close_req.result != 0) goto LAB_0015e6da;
    puStack_d98 = (uv_loop_t *)0x15e496;
    uv_fs_req_cleanup(&close_req);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e4b9;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015e6df;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e6e4;
    puStack_d98 = (uv_loop_t *)0x15e4db;
    uv_fs_req_cleanup(&open_req1);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e4f1;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015e6e9;
    if (close_req.result != 0) goto LAB_0015e6ee;
    puStack_d98 = (uv_loop_t *)0x15e513;
    uv_fs_req_cleanup(&close_req);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e532;
    iVar4 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015e6f3;
    if (rename_req.result != 0) goto LAB_0015e6f8;
    puStack_d98 = (uv_loop_t *)0x15e554;
    uv_fs_req_cleanup(&rename_req);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e571;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015e6fd;
    if (open_req1.result._4_4_ < 0) goto LAB_0015e702;
    puStack_d98 = (uv_loop_t *)0x15e593;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_d98 = (uv_loop_t *)0x15e5b5;
    uVar17 = uv_buf_init(buf,0x20);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e5f3;
    iov = uVar17;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 < 0) goto LAB_0015e707;
    if (read_req.result < 0) goto LAB_0015e70c;
    iVar5 = 0x3120e0;
    puStack_d98 = (uv_loop_t *)0x15e61c;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015e711;
    puStack_d98 = (uv_loop_t *)0x15e630;
    uv_fs_req_cleanup(&read_req);
    iVar5 = 0;
    puStack_d98 = (uv_loop_t *)0x15e646;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015e716;
    if (close_req.result != 0) goto LAB_0015e71b;
    puStack_d98 = (uv_loop_t *)0x15e668;
    uv_fs_req_cleanup(&close_req);
    puStack_d98 = (uv_loop_t *)0x15e674;
    unlink("test_file");
    puStack_d98 = (uv_loop_t *)0x15e680;
    unlink("test_file2");
    puStack_d98 = (uv_loop_t *)0x15e685;
    puVar6 = uv_default_loop();
    puStack_d98 = (uv_loop_t *)0x15e699;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    puStack_d98 = (uv_loop_t *)0x15e6a3;
    uv_run(puVar6,UV_RUN_DEFAULT);
    puStack_d98 = (uv_loop_t *)0x15e6a8;
    puVar7 = uv_default_loop();
    puStack_d98 = (uv_loop_t *)0x15e6b0;
    iVar4 = uv_loop_close(puVar7);
    iVar5 = (int)puVar7;
    if (iVar4 == 0) {
      puStack_d98 = (uv_loop_t *)0x15e6b9;
      uv_library_shutdown();
      return;
    }
  }
  puStack_d98 = (uv_loop_t *)run_test_fs_read_bufs;
  run_test_fs_rename_to_existing_file_cold_20();
  puStack_da0 = (uv_fs_t *)0x15e72b;
  puStack_d98 = puVar6;
  fs_read_bufs(iVar5);
  puStack_da0 = (uv_fs_t *)0x15e730;
  fs_read_bufs(iVar5);
  puStack_da0 = (uv_fs_t *)0x15e735;
  puVar6 = uv_default_loop();
  puStack_da0 = (uv_fs_t *)0x15e749;
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  puStack_da0 = (uv_fs_t *)0x15e753;
  uv_run(puVar6,UV_RUN_DEFAULT);
  puStack_da0 = (uv_fs_t *)0x15e758;
  puVar7 = uv_default_loop();
  puStack_da0 = (uv_fs_t *)0x15e760;
  iVar4 = uv_loop_close(puVar7);
  if (iVar4 == 0) {
    puStack_da0 = (uv_fs_t *)0x15e769;
    uv_library_shutdown();
    return;
  }
  puStack_da0 = (uv_fs_t *)fs_read_bufs;
  run_test_fs_read_bufs_cold_1();
  iVar5 = 0;
  puStack_da8 = puVar6;
  puStack_da0 = puVar11;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    fs_read_bufs_cold_1();
LAB_0015e9d1:
    fs_read_bufs_cold_2();
LAB_0015e9d6:
    fs_read_bufs_cold_3();
LAB_0015e9db:
    fs_read_bufs_cold_4();
LAB_0015e9e0:
    fs_read_bufs_cold_5();
LAB_0015e9e5:
    fs_read_bufs_cold_6();
LAB_0015e9ea:
    fs_read_bufs_cold_7();
LAB_0015e9ef:
    fs_read_bufs_cold_8();
LAB_0015e9f4:
    fs_read_bufs_cold_9();
LAB_0015e9f9:
    fs_read_bufs_cold_10();
LAB_0015e9fe:
    fs_read_bufs_cold_11();
LAB_0015ea03:
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015e9d1;
    uv_fs_req_cleanup(&open_req1);
    iVar5 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar4 != -0x16) goto LAB_0015e9d6;
    iVar5 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                       (uv_fs_cb)0x0);
    if (iVar4 != -0x16) goto LAB_0015e9db;
    iVar5 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_10f0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar4 != -0x16) goto LAB_0015e9e0;
    uStack_10f0 = uv_buf_init(acStack_10b0,0x100);
    uStack_10e0 = uv_buf_init(acStack_fb0,0x100);
    uStack_10d0 = uv_buf_init(acStack_eb0,0x80);
    uStack_10c0 = uv_buf_init(acStack_e30,0x80);
    iVar5 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_10f0,2,0,
                       (uv_fs_cb)0x0);
    if (iVar4 != 0x1be) goto LAB_0015e9e5;
    if (read_req.result != 0x1be) goto LAB_0015e9ea;
    puVar11 = &read_req;
    uv_fs_req_cleanup(&read_req);
    iVar5 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_10d0,2,0x100,
                       (uv_fs_cb)0x0);
    if (iVar4 != 0xbe) goto LAB_0015e9ef;
    if (read_req.result != 0xbe) goto LAB_0015e9f4;
    uv_fs_req_cleanup(&read_req);
    pcVar9 = uStack_10e0.base;
    pcVar14 = uStack_10e0.base;
    iVar4 = bcmp(uStack_10e0.base,uStack_10d0.base,0x80);
    iVar5 = (int)pcVar14;
    if (iVar4 != 0) goto LAB_0015e9f9;
    pcVar9 = pcVar9 + 0x80;
    iVar4 = bcmp(pcVar9,uStack_10c0.base,0x3e);
    iVar5 = (int)pcVar9;
    if (iVar4 != 0) goto LAB_0015e9fe;
    iVar5 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015ea03;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  fs_read_bufs_cold_13();
  fs_read_file_eof(iVar5);
  fs_read_file_eof(iVar5);
  puVar6 = uv_default_loop();
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  uv_run(puVar6,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar4 = uv_loop_close(puVar6);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_read_file_eof_cold_1();
  puVar10 = (uv_fs_t *)0x1a3527;
  puStack_1128 = (uv_fs_t *)0x15ea6e;
  unlink("test_file");
  puStack_1128 = (uv_fs_t *)0x15ea73;
  loop = uv_default_loop();
  iVar5 = 0;
  puStack_1128 = (uv_fs_t *)0x15ea99;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    puStack_1128 = (uv_fs_t *)0x15ecf6;
    fs_read_file_eof_cold_1();
LAB_0015ecf6:
    puStack_1128 = (uv_fs_t *)0x15ecfb;
    fs_read_file_eof_cold_2();
LAB_0015ecfb:
    puStack_1128 = (uv_fs_t *)0x15ed00;
    fs_read_file_eof_cold_3();
LAB_0015ed00:
    puStack_1128 = (uv_fs_t *)0x15ed05;
    fs_read_file_eof_cold_4();
LAB_0015ed05:
    puStack_1128 = (uv_fs_t *)0x15ed0a;
    fs_read_file_eof_cold_5();
LAB_0015ed0a:
    puStack_1128 = (uv_fs_t *)0x15ed0f;
    fs_read_file_eof_cold_6();
LAB_0015ed0f:
    puStack_1128 = (uv_fs_t *)0x15ed14;
    fs_read_file_eof_cold_7();
LAB_0015ed14:
    puStack_1128 = (uv_fs_t *)0x15ed19;
    fs_read_file_eof_cold_8();
LAB_0015ed19:
    puStack_1128 = (uv_fs_t *)0x15ed1e;
    fs_read_file_eof_cold_9();
LAB_0015ed1e:
    puStack_1128 = (uv_fs_t *)0x15ed23;
    fs_read_file_eof_cold_10();
LAB_0015ed23:
    puStack_1128 = (uv_fs_t *)0x15ed28;
    fs_read_file_eof_cold_11();
LAB_0015ed28:
    puStack_1128 = (uv_fs_t *)0x15ed2d;
    fs_read_file_eof_cold_12();
LAB_0015ed2d:
    puStack_1128 = (uv_fs_t *)0x15ed32;
    fs_read_file_eof_cold_13();
LAB_0015ed32:
    puStack_1128 = (uv_fs_t *)0x15ed37;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015ecf6;
    puStack_1128 = (uv_fs_t *)0x15eabb;
    uv_fs_req_cleanup(&open_req1);
    puStack_1128 = (uv_fs_t *)0x15eacc;
    uVar17 = uv_buf_init(test_buf,0xd);
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x15eb0a;
    iov = uVar17;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015ecfb;
    if (write_req.result < 0) goto LAB_0015ed00;
    puStack_1128 = (uv_fs_t *)0x15eb2c;
    uv_fs_req_cleanup(&write_req);
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x15eb42;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015ed05;
    if (close_req.result != 0) goto LAB_0015ed0a;
    puStack_1128 = (uv_fs_t *)0x15eb64;
    uv_fs_req_cleanup(&close_req);
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x15eb81;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015ed0f;
    if (open_req1.result._4_4_ < 0) goto LAB_0015ed14;
    puStack_1128 = (uv_fs_t *)0x15eba3;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_1128 = (uv_fs_t *)0x15ebc5;
    uVar17 = uv_buf_init(buf,0x20);
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x15ec03;
    iov = uVar17;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 < 0) goto LAB_0015ed19;
    if (read_req.result < 0) goto LAB_0015ed1e;
    iVar5 = 0x3120e0;
    puStack_1128 = (uv_fs_t *)0x15ec2c;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015ed23;
    puVar10 = &read_req;
    puStack_1128 = (uv_fs_t *)0x15ec43;
    uv_fs_req_cleanup(&read_req);
    puStack_1128 = (uv_fs_t *)0x15ec54;
    uVar17 = uv_buf_init(buf,0x20);
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x15ec8e;
    iov = uVar17;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015ed28;
    if (read_req.result != 0) goto LAB_0015ed2d;
    puStack_1128 = (uv_fs_t *)0x15ecb0;
    uv_fs_req_cleanup(&read_req);
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x15ecc6;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015ed32;
    if (close_req.result == 0) {
      puStack_1128 = (uv_fs_t *)0x15ece0;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_1128 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_1130 = (uv_fs_t *)0x15ed42;
  puStack_1128 = puVar10;
  fs_write_multiple_bufs(iVar5);
  puStack_1130 = (uv_fs_t *)0x15ed47;
  fs_write_multiple_bufs(iVar5);
  puStack_1130 = (uv_fs_t *)0x15ed4c;
  puVar6 = uv_default_loop();
  puStack_1130 = (uv_fs_t *)0x15ed60;
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  puStack_1130 = (uv_fs_t *)0x15ed6a;
  uv_run(puVar6,UV_RUN_DEFAULT);
  puStack_1130 = (uv_fs_t *)0x15ed6f;
  puVar7 = uv_default_loop();
  puStack_1130 = (uv_fs_t *)0x15ed77;
  iVar4 = uv_loop_close(puVar7);
  if (iVar4 == 0) {
    puStack_1130 = (uv_fs_t *)0x15ed80;
    uv_library_shutdown();
    return;
  }
  puStack_1130 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_1138 = puVar6;
  puStack_1130 = puVar11;
  unlink("test_file");
  loop = uv_default_loop();
  iVar4 = 0;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar5 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015f21c:
    fs_write_multiple_bufs_cold_2();
LAB_0015f221:
    fs_write_multiple_bufs_cold_3();
LAB_0015f226:
    fs_write_multiple_bufs_cold_4();
LAB_0015f22b:
    fs_write_multiple_bufs_cold_5();
LAB_0015f230:
    fs_write_multiple_bufs_cold_6();
LAB_0015f235:
    fs_write_multiple_bufs_cold_7();
LAB_0015f23a:
    fs_write_multiple_bufs_cold_8();
LAB_0015f23f:
    fs_write_multiple_bufs_cold_9();
LAB_0015f244:
    fs_write_multiple_bufs_cold_10();
LAB_0015f249:
    fs_write_multiple_bufs_cold_11();
LAB_0015f24e:
    fs_write_multiple_bufs_cold_12();
LAB_0015f253:
    fs_write_multiple_bufs_cold_13();
LAB_0015f258:
    fs_write_multiple_bufs_cold_14();
LAB_0015f25d:
    fs_write_multiple_bufs_cold_15();
LAB_0015f262:
    fs_write_multiple_bufs_cold_16();
LAB_0015f267:
    fs_write_multiple_bufs_cold_19();
LAB_0015f26c:
    fs_write_multiple_bufs_cold_20();
LAB_0015f271:
    fs_write_multiple_bufs_cold_21();
LAB_0015f276:
    fs_write_multiple_bufs_cold_22();
LAB_0015f27b:
    fs_write_multiple_bufs_cold_23();
LAB_0015f280:
    fs_write_multiple_bufs_cold_24();
LAB_0015f285:
    fs_write_multiple_bufs_cold_25();
LAB_0015f28a:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015f21c;
    uv_fs_req_cleanup(&open_req1);
    uStack_1160 = uv_buf_init(test_buf,0xd);
    uStack_1150 = uv_buf_init(test_buf2,0xf);
    iVar4 = 0;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_1160,2,0,
                        (uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f221;
    if (write_req.result < 0) goto LAB_0015f226;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0015f22b;
    if (close_req.result != 0) goto LAB_0015f230;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f235;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f23a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_1160 = uv_buf_init(buf,0xd);
    uStack_1150 = uv_buf_init(buf2,0xf);
    iVar4 = (uv_file)open_req1.result;
    _Var8 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var8 != 0) goto LAB_0015f23f;
    iVar4 = 0;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_1160,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f244;
    if (read_req.result != 0x1c) goto LAB_0015f249;
    iVar4 = 0x3120e0;
    iVar5 = strcmp(buf,test_buf);
    if (iVar5 != 0) goto LAB_0015f24e;
    iVar4 = 0x3140d0;
    iVar5 = strcmp(buf2,test_buf2);
    if (iVar5 != 0) goto LAB_0015f253;
    uv_fs_req_cleanup(&read_req);
    uVar17 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar17;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar5 != 0) goto LAB_0015f258;
    if (read_req.result != 0) goto LAB_0015f25d;
    uv_fs_req_cleanup(&read_req);
    uStack_1160 = uv_buf_init(buf,0xd);
    uStack_1150 = uv_buf_init(buf2,0xf);
    iVar4 = 0;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_1160,2,0,
                       (uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f262;
    if (read_req.result == 0x1c) {
LAB_0015f11a:
      iVar4 = 0x3120e0;
      iVar5 = strcmp(buf,test_buf);
      if (iVar5 != 0) goto LAB_0015f267;
      iVar4 = 0x3140d0;
      iVar5 = strcmp(buf2,test_buf2);
      if (iVar5 != 0) goto LAB_0015f26c;
      uv_fs_req_cleanup(&read_req);
      uVar17 = uv_buf_init(buf,0x20);
      iVar4 = 0;
      iov = uVar17;
      iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar5 != 0) goto LAB_0015f271;
      if (read_req.result != 0) goto LAB_0015f276;
      uv_fs_req_cleanup(&read_req);
      iVar4 = 0;
      iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar5 != 0) goto LAB_0015f27b;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_0015f280;
    }
    if (read_req.result != 0xd) goto LAB_0015f285;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_1150,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f28a;
    if (read_req.result == 0xf) goto LAB_0015f11a;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar4);
  fs_write_alotof_bufs(iVar4);
  puVar6 = uv_default_loop();
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  uv_run(puVar6,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar4 = uv_loop_close(puVar6);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar4 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_0015f611:
    fs_write_alotof_bufs_cold_18();
LAB_0015f616:
    fs_write_alotof_bufs_cold_1();
LAB_0015f61b:
    fs_write_alotof_bufs_cold_2();
LAB_0015f620:
    fs_write_alotof_bufs_cold_3();
LAB_0015f625:
    fs_write_alotof_bufs_cold_4();
LAB_0015f62a:
    fs_write_alotof_bufs_cold_17();
LAB_0015f62f:
    fs_write_alotof_bufs_cold_5();
LAB_0015f634:
    fs_write_alotof_bufs_cold_6();
LAB_0015f639:
    fs_write_alotof_bufs_cold_7();
LAB_0015f63e:
    fs_write_alotof_bufs_cold_8();
LAB_0015f643:
    fs_write_alotof_bufs_cold_9();
LAB_0015f648:
    fs_write_alotof_bufs_cold_10();
LAB_0015f64d:
    fs_write_alotof_bufs_cold_12();
LAB_0015f652:
    fs_write_alotof_bufs_cold_13();
LAB_0015f657:
    fs_write_alotof_bufs_cold_14();
LAB_0015f65c:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar4 = 0;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f616;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f61b;
    uv_fs_req_cleanup(&open_req1);
    lVar13 = 8;
    do {
      uVar17 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar13 + -8) = uVar17.base;
      *(size_t *)((long)&bufs->base + lVar13) = uVar17.len;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0xd4318);
    iVar4 = 0;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f620;
    if (write_req.result != 0xac67d) goto LAB_0015f625;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0xac67d;
    pcVar9 = (char *)malloc(0xac67d);
    if (pcVar9 == (char *)0x0) goto LAB_0015f62a;
    lVar13 = 8;
    pcVar14 = pcVar9;
    do {
      uVar17 = uv_buf_init(pcVar14,0xd);
      *(char **)((long)bufs + lVar13 + -8) = uVar17.base;
      *(size_t *)((long)&bufs->base + lVar13) = uVar17.len;
      lVar13 = lVar13 + 0x10;
      pcVar14 = pcVar14 + 0xd;
    } while (lVar13 != 0xd4318);
    iVar4 = 0;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0015f62f;
    if (close_req.result != 0) goto LAB_0015f634;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f639;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f63e;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_0015f643;
    if (read_req.result != 0x3400) goto LAB_0015f648;
    lVar13 = 0;
    do {
      pcVar14 = pcVar9 + lVar13;
      iVar5 = strncmp(pcVar14,test_buf,0xd);
      iVar4 = (int)pcVar14;
      if (iVar5 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_0015f611;
      }
      lVar13 = lVar13 + 0xd;
    } while (lVar13 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar9);
    iVar4 = (uv_file)open_req1.result;
    _Var8 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var8 != write_req.result) goto LAB_0015f64d;
    uVar17 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar17;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar5 != 0) goto LAB_0015f652;
    if (read_req.result != 0) goto LAB_0015f657;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0015f65c;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar4);
  fs_write_alotof_bufs_with_offset(iVar4);
  puVar6 = uv_default_loop();
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  uv_run(puVar6,UV_RUN_DEFAULT);
  puVar7 = uv_default_loop();
  iVar4 = uv_loop_close(puVar7);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_11f8 = (uv_loop_t *)0x15f6cd;
  unlink("test_file");
  puStack_11f8 = (uv_loop_t *)0x15f6d2;
  loop = uv_default_loop();
  puStack_11f8 = (uv_loop_t *)0x15f6e3;
  puVar7 = (uv_loop_t *)malloc(0xd4310);
  if (puVar7 == (uv_loop_t *)0x0) {
LAB_0015fa2f:
    puVar7 = puVar6;
    puStack_11f8 = (uv_loop_t *)0x15fa34;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_0015fa34:
    puStack_11f8 = (uv_loop_t *)0x15fa39;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_0015fa39:
    puStack_11f8 = (uv_loop_t *)0x15fa3e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015fa3e:
    puStack_11f8 = (uv_loop_t *)0x15fa43;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015fa43:
    puStack_11f8 = (uv_loop_t *)0x15fa48;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_0015fa48:
    puStack_11f8 = (uv_loop_t *)0x15fa4d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015fa4d:
    puStack_11f8 = (uv_loop_t *)0x15fa52;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015fa52:
    puStack_11f8 = (uv_loop_t *)0x15fa57;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_0015fa57:
    puStack_11f8 = (uv_loop_t *)0x15fa5c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015fa5c:
    puStack_11f8 = (uv_loop_t *)0x15fa61;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015fa61:
    puStack_11f8 = (uv_loop_t *)0x15fa66;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_0015fa66:
    puStack_11f8 = (uv_loop_t *)0x15fa6b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015fa6b:
    puStack_11f8 = (uv_loop_t *)0x15fa70;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015fa70:
    puStack_11f8 = (uv_loop_t *)0x15fa75;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_0015fa75:
    puStack_11f8 = (uv_loop_t *)0x15fa7a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_11f8 = (uv_loop_t *)0x15f712;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015fa34;
    if (open_req1.result._4_4_ < 0) goto LAB_0015fa39;
    puStack_11f8 = (uv_loop_t *)0x15f734;
    uv_fs_req_cleanup(&open_req1);
    puStack_11f8 = (uv_loop_t *)0x15f745;
    uVar17 = uv_buf_init("0123456789",10);
    puStack_11f8 = (uv_loop_t *)0x15f783;
    iov = uVar17;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 != 10) goto LAB_0015fa3e;
    if (write_req.result != 10) goto LAB_0015fa43;
    puStack_11f8 = (uv_loop_t *)0x15f7a8;
    uv_fs_req_cleanup(&write_req);
    lVar13 = 8;
    do {
      puStack_11f8 = (uv_loop_t *)0x15f7c2;
      uVar17 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar7->handle_queue + lVar13 + -0x18) = uVar17.base;
      *(size_t *)((long)puVar7->handle_queue + lVar13 + -0x10) = uVar17.len;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0xd4318);
    puStack_11f8 = (uv_loop_t *)0x15f803;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar7,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015fa48;
    if (write_req.result != 0xac67d) goto LAB_0015fa4d;
    puStack_11f8 = (uv_loop_t *)0x15f828;
    uv_fs_req_cleanup(&write_req);
    puStack_11f8 = (uv_loop_t *)0x15f832;
    pcVar9 = (char *)malloc(0xac67d);
    if (pcVar9 == (char *)0x0) goto LAB_0015fa52;
    lVar13 = 8;
    pcVar14 = pcVar9;
    do {
      puStack_11f8 = (uv_loop_t *)0x15f854;
      uVar17 = uv_buf_init(pcVar14,0xd);
      *(char **)((long)puVar7->handle_queue + lVar13 + -0x18) = uVar17.base;
      *(size_t *)((long)puVar7->handle_queue + lVar13 + -0x10) = uVar17.len;
      lVar13 = lVar13 + 0x10;
      pcVar14 = pcVar14 + 0xd;
    } while (lVar13 != 0xd4318);
    puStack_11f8 = (uv_loop_t *)0x15f896;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar7,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015fa57;
    lVar13 = 0xd;
    if (iVar4 != 0xd) {
      lVar13 = 0x3400;
    }
    if (read_req.result != lVar13) goto LAB_0015fa5c;
    pcVar14 = pcVar9;
    uVar12 = 0;
    do {
      puStack_11f8 = (uv_loop_t *)0x15f8e0;
      iVar5 = strncmp(pcVar14,test_buf,0xd);
      if (iVar5 != 0) {
        puStack_11f8 = (uv_loop_t *)0x15fa2f;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar6 = puVar7;
        goto LAB_0015fa2f;
      }
      if (iVar4 == 0xd) break;
      pcVar14 = pcVar14 + 0xd;
      bVar2 = uVar12 < 0x3ff;
      uVar12 = uVar12 + 1;
    } while (bVar2);
    puStack_11f8 = (uv_loop_t *)0x15f90d;
    uv_fs_req_cleanup(&read_req);
    puStack_11f8 = (uv_loop_t *)0x15f915;
    free(pcVar9);
    puStack_11f8 = (uv_loop_t *)0x15f92c;
    iVar4 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015fa61;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_0015fa66;
    puStack_11f8 = (uv_loop_t *)0x15f960;
    uv_fs_req_cleanup(&stat_req);
    puStack_11f8 = (uv_loop_t *)0x15f971;
    uVar17 = uv_buf_init(buf,0x20);
    puStack_11f8 = (uv_loop_t *)0x15f9b2;
    iov = uVar17;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015fa6b;
    if (read_req.result != 0) goto LAB_0015fa70;
    puStack_11f8 = (uv_loop_t *)0x15f9d4;
    uv_fs_req_cleanup(&read_req);
    puStack_11f8 = (uv_loop_t *)0x15f9ea;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015fa75;
    if (close_req.result == 0) {
      puStack_11f8 = (uv_loop_t *)0x15fa08;
      uv_fs_req_cleanup(&close_req);
      puStack_11f8 = (uv_loop_t *)0x15fa14;
      unlink("test_file");
      free(puVar7);
      return;
    }
  }
  puStack_11f8 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_11f8 = puVar7;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar4 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar4 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_0015fbf6;
    iVar4 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015fbfb;
    uv_fs_req_cleanup(&open_req1);
    uVar17 = uv_buf_init(acStack_11fa,2);
    iov = uVar17;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar4 != -0x15) goto LAB_0015fc00;
    uv_fs_req_cleanup(&read_req);
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uv_run(puVar6,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      iVar4 = uv_loop_close(puVar6);
      if (iVar4 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015fc0a;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015fbf6:
    run_test_fs_read_dir_cold_2();
LAB_0015fbfb:
    run_test_fs_read_dir_cold_3();
LAB_0015fc00:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_0015fc0a:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void utime_cb(uv_fs_t* req) {
  utime_check_t* c;

  ASSERT(req == &utime_req);
  ASSERT(req->result == 0);
  ASSERT(req->fs_type == UV_FS_UTIME);

  c = req->data;
  check_utime(c->path, c->atime, c->mtime, /* test_lutime */ 0);

  uv_fs_req_cleanup(req);
  utime_cb_count++;
}